

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O2

QNetworkRequest __thiscall
QNetworkRequestFactoryPrivate::newRequest(QNetworkRequestFactoryPrivate *this,QUrl *url)

{
  bool bVar1;
  QUrl *in_RDX;
  long in_FS_OFFSET;
  pair<const_QNetworkRequest::Attribute_&,_const_QVariant_&> pVar2;
  piter local_78;
  qsizetype local_68;
  QStringBuilder<const_char_(&)[8],_const_QByteArray_&> local_58;
  QAnyStringView local_48;
  QHttpHeaders h;
  char local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)this);
  QNetworkRequest::setUrl((QNetworkRequest *)this,in_RDX);
  bVar1 = QSslConfiguration::isNull((QSslConfiguration *)(url + 1));
  if (!bVar1) {
    QNetworkRequest::setSslConfiguration((QNetworkRequest *)this,(QSslConfiguration *)(url + 1));
  }
  h.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHttpHeaders::QHttpHeaders(&h,(QHttpHeaders *)(url + 3));
  builtin_strncpy(local_30,"Bearer ",8);
  if (url[6].d != (QUrlPrivate *)0x0) {
    local_58.b = (QByteArray *)(url + 4);
    local_58.a = &local_30;
    local_78 = (piter)ZEXT816(0);
    local_68 = 0;
    QAnyStringView::QAnyStringView<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_true>
              (&local_48,&local_58,
               (wrapped_t<QStringBuilder<const_char_(&)[8],_const_QByteArray_&>,_QByteArray> *)
               &local_78);
    QHttpHeaders::replaceOrAppend(&h,Authorization,local_48);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  }
  QNetworkRequest::setHeaders((QNetworkRequest *)this,&h);
  QNetworkRequest::setTransferTimeout((QNetworkRequest *)this,(milliseconds)url[0xf].d);
  QNetworkRequest::setPriority((QNetworkRequest *)this,*(Priority *)&url[0xe].d);
  local_78 = (piter)QHash<QNetworkRequest::Attribute,_QVariant>::begin
                              ((QHash<QNetworkRequest::Attribute,_QVariant> *)(url + 0x10));
  while ((local_78.d != (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)0x0 ||
         (local_78.bucket != 0))) {
    pVar2 = QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
            ::operator*((QKeyValueIterator<const_QNetworkRequest::Attribute_&,_const_QVariant_&,_QHash<QNetworkRequest::Attribute,_QVariant>::const_iterator>
                         *)&local_78);
    QNetworkRequest::setAttribute((QNetworkRequest *)this,*pVar2.first,pVar2.second);
    QHashPrivate::iterator<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::operator++
              (&local_78);
  }
  QHttpHeaders::~QHttpHeaders(&h);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSharedDataPointer<QNetworkRequestPrivate>)
           (QSharedDataPointer<QNetworkRequestPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkRequest QNetworkRequestFactoryPrivate::newRequest(const QUrl &url) const
{
    QNetworkRequest request;
    request.setUrl(url);
#if QT_CONFIG(ssl)
    if (!sslConfig.isNull())
        request.setSslConfiguration(sslConfig);
#endif
    auto h = headers;
    constexpr char Bearer[] = "Bearer ";
    if (!bearerToken.isEmpty())
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::Authorization, Bearer + bearerToken);
    request.setHeaders(std::move(h));

    request.setTransferTimeout(transferTimeout);
    request.setPriority(priority);

    for (const auto &[attribute, value] : attributes.asKeyValueRange())
        request.setAttribute(attribute, value);

    return request;
}